

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_gcc.cc
# Opt level: O1

void ARGBToARGB1555Row_SSE2(uint8_t *src,uint8_t *dst,int width)

{
  bool bVar1;
  undefined1 auVar2 [16];
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  
  auVar13._8_4_ = 0x3e0;
  auVar13._0_8_ = 0x3e0000003e0;
  auVar13._12_4_ = 0x3e0;
  auVar14._8_4_ = 0x7c00;
  auVar14._0_8_ = 0x7c0000007c00;
  auVar14._12_4_ = 0x7c00;
  do {
    uVar3 = *(uint *)src;
    uVar4 = *(uint *)((long)src + 4);
    uVar5 = *(uint *)((long)src + 8);
    uVar6 = *(uint *)((long)src + 0xc);
    auVar8._0_4_ = (int)uVar3 >> 0x10;
    auVar8._4_4_ = (int)uVar4 >> 0x10;
    auVar8._8_4_ = (int)uVar5 >> 0x10;
    auVar8._12_4_ = (int)uVar6 >> 0x10;
    auVar10._0_4_ = uVar3 >> 3;
    auVar10._4_4_ = uVar4 >> 3;
    auVar10._8_4_ = uVar5 >> 3;
    auVar10._12_4_ = uVar6 >> 3;
    auVar11._0_4_ = uVar3 >> 6;
    auVar11._4_4_ = uVar4 >> 6;
    auVar11._8_4_ = uVar5 >> 6;
    auVar11._12_4_ = uVar6 >> 6;
    auVar12._0_4_ = uVar3 >> 9;
    auVar12._4_4_ = uVar4 >> 9;
    auVar12._8_4_ = uVar5 >> 9;
    auVar12._12_4_ = uVar6 >> 9;
    auVar2[9] = 0x80;
    auVar2._0_9_ = (unkuint9)0xffff8000ffff8000;
    auVar2[10] = 0xff;
    auVar2[0xb] = 0xff;
    auVar2[0xc] = 0;
    auVar2[0xd] = 0x80;
    auVar2[0xe] = 0xff;
    auVar2[0xf] = 0xff;
    auVar9[8] = 0x1f;
    auVar9._0_8_ = 0x1f0000001f;
    auVar9._9_3_ = 0;
    auVar9[0xc] = 0x1f;
    auVar9._13_3_ = 0;
    auVar9 = auVar8 & auVar2 | auVar10 & auVar9 | auVar11 & auVar13 | auVar12 & auVar14;
    auVar9 = packssdw(auVar9,auVar9);
    src = (uint8_t *)((long)src + 0x10);
    *(long *)dst = auVar9._0_8_;
    dst = dst + 8;
    iVar7 = width + -4;
    bVar1 = 3 < width;
    width = iVar7;
  } while (iVar7 != 0 && bVar1);
  return;
}

Assistant:

void ARGBToARGB1555Row_SSE2(const uint8_t* src, uint8_t* dst, int width) {
  asm volatile(
      "pcmpeqb     %%xmm4,%%xmm4                 \n"
      "psrld       $0x1b,%%xmm4                  \n"
      "movdqa      %%xmm4,%%xmm5                 \n"
      "pslld       $0x5,%%xmm5                   \n"
      "movdqa      %%xmm4,%%xmm6                 \n"
      "pslld       $0xa,%%xmm6                   \n"
      "pcmpeqb     %%xmm7,%%xmm7                 \n"
      "pslld       $0xf,%%xmm7                   \n"

      LABELALIGN
      "1:                                        \n"
      "movdqu      (%0),%%xmm0                   \n"
      "movdqa      %%xmm0,%%xmm1                 \n"
      "movdqa      %%xmm0,%%xmm2                 \n"
      "movdqa      %%xmm0,%%xmm3                 \n"
      "psrad       $0x10,%%xmm0                  \n"
      "psrld       $0x3,%%xmm1                   \n"
      "psrld       $0x6,%%xmm2                   \n"
      "psrld       $0x9,%%xmm3                   \n"
      "pand        %%xmm7,%%xmm0                 \n"
      "pand        %%xmm4,%%xmm1                 \n"
      "pand        %%xmm5,%%xmm2                 \n"
      "pand        %%xmm6,%%xmm3                 \n"
      "por         %%xmm1,%%xmm0                 \n"
      "por         %%xmm3,%%xmm2                 \n"
      "por         %%xmm2,%%xmm0                 \n"
      "packssdw    %%xmm0,%%xmm0                 \n"
      "lea         0x10(%0),%0                   \n"
      "movq        %%xmm0,(%1)                   \n"
      "lea         0x8(%1),%1                    \n"
      "sub         $0x4,%2                       \n"
      "jg          1b                            \n"
      : "+r"(src),   // %0
        "+r"(dst),   // %1
        "+r"(width)  // %2
        ::"memory",
        "cc", "xmm0", "xmm1", "xmm2", "xmm3", "xmm4", "xmm5", "xmm6", "xmm7");
}